

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::default_unit(string *unit_type)

{
  char *pcVar1;
  ulong uVar2;
  precise_unit pVar3;
  precise_unit pVar4;
  bool bVar5;
  int iVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  const_iterator cVar8;
  size_type sVar9;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type sVar10;
  long lVar11;
  long *plVar12;
  precise_unit pVar13;
  undefined8 uStack_1c0;
  allocator<char> local_1b1;
  double local_1b0;
  precise_unit tunit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_)
     , iVar6 != 0)) {
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_buckets =
         &default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_single_bucket;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_bucket_count = 1;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_element_count = 0;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_rehash_policy.
    _M_max_load_factor = 1.0;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_rehash_policy._4_4_ = 0
    ;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_rehash_policy.
    _M_next_resize = 0;
    default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_single_bucket =
         (__node_base_ptr)0x0;
    plVar12 = &defined_measurement_types;
    for (lVar11 = 0x1728; lVar11 != 0; lVar11 = lVar11 + -0x18) {
      if (*plVar12 != 0) {
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,units::precise_unit>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<char_const*const&,units::precise_unit_const&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,units::precise_unit>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_,plVar12,
                   plVar12 + 1);
      }
      plVar12 = plVar12 + 3;
    }
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                 ::~unordered_map,&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_);
  }
  pcVar1 = (unit_type->_M_dataplus)._M_p;
  sVar9 = unit_type->_M_string_length;
  if (sVar9 != 1) goto switchD_00352ff0_caseD_4b;
  switch(*pcVar1) {
  case 'I':
    pVar3.base_units_ = (unit_data)0x800;
    pVar3.commodity_ = 0;
    pVar3.multiplier_ = 1.0;
    break;
  case 'J':
    pVar3.base_units_ = (unit_data)0x4000;
    pVar3.commodity_ = 0;
    pVar3.multiplier_ = 1.0;
    break;
  case 'K':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
    goto switchD_00352ff0_caseD_4b;
  case 'L':
    uStack_1c0 = 1;
    goto LAB_00353136;
  case 'M':
    pVar3.base_units_ = (unit_data)0x100;
    pVar3.commodity_ = 0;
    pVar3.multiplier_ = 1.0;
    break;
  case 'N':
    pVar3.base_units_ = (unit_data)0x80000;
    pVar3.commodity_ = 0;
    pVar3.multiplier_ = 1.0;
    break;
  case 'T':
    uStack_1c0 = 0x10;
LAB_00353136:
    pVar3.base_units_ = (unit_data)(undefined4)uStack_1c0;
    pVar3.commodity_ = uStack_1c0._4_4_;
    pVar3.multiplier_ = 1.0;
    break;
  default:
    if (*pcVar1 == -0x38) {
      pVar13.base_units_ = (unit_data)0x10000;
      pVar13.commodity_ = 0;
      pVar13.multiplier_ = 1.0;
      return pVar13;
    }
switchD_00352ff0_caseD_4b:
    for (sVar10 = 0; sVar9 != sVar10; sVar10 = sVar10 + 1) {
      iVar6 = tolower((int)pcVar1[sVar10]);
      pcVar1[sVar10] = (char)iVar6;
    }
    _Var7._M_current = (unit_type->_M_dataplus)._M_p;
    tunit.multiplier_._0_1_ = 0x20;
    _Var7 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (_Var7,_Var7._M_current + unit_type->_M_string_length,
                       (_Iter_equals_val<const_char>)&tunit);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,
               (__const_iterator)_Var7._M_current,
               (__const_iterator)((unit_type->_M_dataplus)._M_p + unit_type->_M_string_length));
    cVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h,unit_type)
    ;
    if (cVar8.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
        ._M_cur != (__node_type *)0x0) {
      return *(precise_unit *)
              ((long)cVar8.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                     ._M_cur + 0x28);
    }
    iVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,0
                    ,10,"quantityof");
    if (iVar6 == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,10,
                 0xffffffffffffffff);
      pVar13 = default_unit((string *)&local_48);
      this = &local_48;
    }
    else {
      iVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type
                      ,0,6,"rateof");
      if (iVar6 == 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,6,
                   0xffffffffffffffff);
        tunit = default_unit((string *)&local_68);
        pVar13 = precise_unit::operator/(&tunit,(precise_unit *)precise::s);
        this = &local_68;
      }
      else {
        sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                rfind(unit_type,"of",0xffffffffffffffff);
        if (sVar9 == 0xffffffffffffffff) {
          __n = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )unit_type,"([{",0);
          if (__n == 0xffffffffffffffff) {
            iVar6 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_type,0,3,"inv");
            if (iVar6 == 0) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,
                     3,0xffffffffffffffff);
              pVar13 = default_unit((string *)&local_c8);
              local_1b0 = pVar13.multiplier_;
              tunit = pVar13;
              std::__cxx11::string::~string((string *)&local_c8);
              if (pVar13.base_units_ != (unit_data)0xfa94a488 && !NAN(local_1b0)) {
                pVar13 = precise_unit::inv(&tunit);
                return pVar13;
              }
            }
            std::__cxx11::string::string<std::allocator<char>>((string *)&tunit,"rto",&local_1b1);
            bVar5 = ends_with(unit_type,(string *)&tunit);
            std::__cxx11::string::~string((string *)&tunit);
            if (bVar5) {
LAB_003532f1:
              return (precise_unit)ZEXT816(0x3ff0000000000000);
            }
            std::__cxx11::string::string<std::allocator<char>>((string *)&tunit,"fr",&local_1b1);
            bVar5 = ends_with(unit_type,(string *)&tunit);
            std::__cxx11::string::~string((string *)&tunit);
            if (bVar5) goto LAB_003532f1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&tunit,"quantity",&local_1b1);
            bVar5 = ends_with(unit_type,(string *)&tunit);
            std::__cxx11::string::~string((string *)&tunit);
            if (bVar5) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,
                     0,unit_type->_M_string_length - 8);
              pVar13 = default_unit((string *)&local_e8);
              this = &local_e8;
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&tunit,"quantities",&local_1b1);
              bVar5 = ends_with(unit_type,(string *)&tunit);
              std::__cxx11::string::~string((string *)&tunit);
              if (bVar5) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::substr(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         unit_type,0,unit_type->_M_string_length - 10);
                pVar13 = default_unit((string *)&local_108);
                this = &local_108;
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&tunit,"measure",&local_1b1);
                bVar5 = ends_with(unit_type,(string *)&tunit);
                std::__cxx11::string::~string((string *)&tunit);
                if (bVar5) {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                            (&local_128,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_type,0,unit_type->_M_string_length - 7);
                  pVar13 = default_unit((string *)&local_128);
                  this = &local_128;
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&tunit,"size",&local_1b1);
                  bVar5 = ends_with(unit_type,(string *)&tunit);
                  std::__cxx11::string::~string((string *)&tunit);
                  uVar2 = unit_type->_M_string_length;
                  if (bVar5) {
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                              (&local_148,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_type,0,uVar2 - 4);
                    pVar13 = default_unit((string *)&local_148);
                    this = &local_148;
                  }
                  else if ((uVar2 < 2) || ((unit_type->_M_dataplus)._M_p[uVar2 - 1] != 's')) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&tunit,"rate",&local_1b1);
                    bVar5 = ends_with(unit_type,(string *)&tunit);
                    std::__cxx11::string::~string((string *)&tunit);
                    if (!bVar5) {
                      pVar4.base_units_ = (unit_data)0xfa94a488;
                      pVar4.commodity_ = 0;
                      pVar4.multiplier_ = NAN;
                      return pVar4;
                    }
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                              (&local_188,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_type,0,unit_type->_M_string_length - 4);
                    tunit = default_unit((string *)&local_188);
                    pVar13 = precise_unit::operator/(&tunit,(precise_unit *)precise::s);
                    this = &local_188;
                  }
                  else {
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_type);
                    std::__cxx11::string::string
                              ((string *)&local_168,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_type);
                    pVar13 = default_unit(&local_168);
                    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_168;
                  }
                }
              }
            }
          }
          else {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,0,
                   __n);
            pVar13 = default_unit((string *)&local_a8);
            this = &local_a8;
          }
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,0,
                 sVar9);
          pVar13 = default_unit((string *)&local_88);
          this = &local_88;
        }
      }
    }
    local_1b0 = pVar13.multiplier_;
    std::__cxx11::string::~string((string *)this);
    pVar3.base_units_ = (unit_data)(int)pVar13._8_8_;
    pVar3.commodity_ = (int)((ulong)pVar13._8_8_ >> 0x20);
    pVar3.multiplier_ = local_1b0;
  }
  return pVar3;
}

Assistant:

precise_unit default_unit(std::string unit_type)
{
    static const smap measurement_types = loadDefinedMeasurementTypes();

    if (unit_type.size() == 1) {
        switch (unit_type[0]) {
            case 'L':
                return precise::m;
            case 'M':
                return precise::kg;
            case 'T':
                return precise::second;
            case '\xC8':
                return precise::Kelvin;
            case 'I':
                return precise::A;
            case 'N':
                return precise::mol;
            case 'J':
                return precise::cd;
        }
    }
    std::transform(
        unit_type.begin(), unit_type.end(), unit_type.begin(), ::tolower);
    unit_type.erase(
        std::remove(unit_type.begin(), unit_type.end(), ' '), unit_type.end());
    auto fnd = measurement_types.find(unit_type);
    if (fnd != measurement_types.end()) {
        return fnd->second;
    }
    if (unit_type.compare(0, 10, "quantityof") == 0) {
        return default_unit(unit_type.substr(10));
    }
    if (unit_type.compare(0, 6, "rateof") == 0) {
        return default_unit(unit_type.substr(6)) / precise::s;
    }
    auto fof = unit_type.rfind("of");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    fof = unit_type.find_first_of("([{");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    if (unit_type.compare(0, 3, "inv") == 0) {
        auto tunit = default_unit(unit_type.substr(3));
        if (!is_error(tunit)) {
            return tunit.inv();
        }
    }
    if (ends_with(unit_type, "rto")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "fr")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "quantity")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantity")));
    }
    if (ends_with(unit_type, "quantities")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantities")));
    }
    if (ends_with(unit_type, "measure")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("measure")));
    }
    if (ends_with(unit_type, "size")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("size")));
    }
    if (unit_type.back() == 's' && unit_type.size() > 1) {
        unit_type.pop_back();
        return default_unit(unit_type);
    }
    if (ends_with(unit_type, "rate")) {
        return default_unit(
                   unit_type.substr(0, unit_type.size() - strlen("rate"))) /
            precise::s;
    }
    return precise::invalid;
}